

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_hmac.c
# Opt level: O0

int csp_hmac_process(hmac_state *hmac,uint8_t *in,uint32_t inlen)

{
  uint32_t in_EDX;
  void *in_RSI;
  csp_sha1_state_t *in_RDI;
  undefined4 local_4;
  
  if ((in_RDI == (csp_sha1_state_t *)0x0) || (in_RSI == (void *)0x0)) {
    local_4 = -2;
  }
  else {
    csp_sha1_process(in_RDI,in_RSI,in_EDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int csp_hmac_process(hmac_state * hmac, const uint8_t * in, uint32_t inlen) {

	/* NULL pointer check */
	if (!hmac || !in)
		return CSP_ERR_INVAL;

	/* Process data */
	csp_sha1_process(&hmac->md, in, inlen);

	return CSP_ERR_NONE;
}